

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property::write_dts(property *this,FILE *file,int indent)

{
  bool bVar1;
  char *__s;
  size_type sVar2;
  reference pvVar3;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  *p_Var4;
  reference ppVar5;
  pointer this_00;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_a0;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_98;
  iterator e_1;
  iterator i_2;
  value_iterator e;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_78;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  i_1;
  undefined1 local_60 [8];
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> v;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *vals;
  int local_20;
  int local_1c;
  int i;
  int indent_local;
  FILE *file_local;
  property *this_local;
  
  local_1c = indent;
  _i = (FILE *)file;
  file_local = (FILE *)this;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    putc(9,_i);
  }
  std::__cxx11::string::string((string *)&vals);
  bVar1 = std::operator!=(&this->key,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vals
                         );
  std::__cxx11::string::~string((string *)&vals);
  if (bVar1) {
    __s = (char *)std::__cxx11::string::c_str();
    fputs(__s,_i);
  }
  bVar1 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::empty
                    (&this->values);
  if (!bVar1) {
    v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->values;
    std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::vector
              ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
               local_60);
    sVar2 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::size
                      (&this->values);
    if (1 < sVar2) {
      v.super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_60;
      pvVar3 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
               front(&this->values);
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                 local_60,pvVar3);
      e = begin(this);
      p_Var4 = __gnu_cxx::
               __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
               ::operator++(&e);
      local_78._M_current = p_Var4->_M_current;
      i_2._M_current = (property_value *)end(this);
      while (bVar1 = __gnu_cxx::operator!=(&local_78,&i_2), bVar1) {
        pvVar3 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
                 back((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *
                      )local_60);
        ppVar5 = __gnu_cxx::
                 __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                 ::operator*(&local_78);
        bVar1 = property_value::try_to_merge(pvVar3,ppVar5);
        if (!bVar1) {
          ppVar5 = __gnu_cxx::
                   __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                   ::operator*(&local_78);
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                    local_60,ppVar5);
        }
        __gnu_cxx::
        __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
        ::operator++(&local_78);
      }
    }
    fputs(" = ",_i);
    e_1 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::begin
                    ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                     v.
                     super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_98._M_current =
         (property_value *)
         std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::end
                   ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                    v.
                    super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while (bVar1 = __gnu_cxx::operator!=(&e_1,&local_98), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                ::operator->(&e_1);
      property_value::write_dts(this_00,(FILE *)_i);
      local_a0 = __gnu_cxx::
                 __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                 ::operator+(&e_1,1);
      bVar1 = __gnu_cxx::operator!=(&local_a0,&local_98);
      if (bVar1) {
        putc(0x2c,_i);
        putc(0x20,_i);
      }
      __gnu_cxx::
      __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
      ::operator++(&e_1);
    }
    std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::~vector
              ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
               local_60);
  }
  fputs(";\n",_i);
  return;
}

Assistant:

void
property::write_dts(FILE *file, int indent)
{
	for (int i=0 ; i<indent ; i++)
	{
		putc('\t', file);
	}
#ifdef PRINT_LABELS
	for (auto &l : labels)
	{
		fputs(l.c_str(), file);
		fputs(": ", file);
	}
#endif
	if (key != string())
	{
		fputs(key.c_str(), file);
	}
	if (!values.empty())
	{
		std::vector<property_value> *vals = &values;
		std::vector<property_value> v;
		// If we've got multiple values then try to merge them all together.
		if (values.size() > 1)
		{
			vals = &v;
			v.push_back(values.front());
			for (auto i=(++begin()), e=end() ; i!=e ; ++i)
			{
				if (!v.back().try_to_merge(*i))
				{
					v.push_back(*i);
				}
			}
		}
		fputs(" = ", file);
		for (auto i=vals->begin(), e=vals->end() ; i!=e ; ++i)
		{
			i->write_dts(file);
			if (i+1 != e)
			{
				putc(',', file);
				putc(' ', file);
			}
		}
	}
	fputs(";\n", file);
}